

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O2

Message * __thiscall hrgls::Message::operator=(Message *this,Message *copy)

{
  hrgls_Status hVar1;
  Message_private *pMVar2;
  hrgls_Message phVar3;
  Message_private *pMVar4;
  
  pMVar4 = this->m_private;
  if (pMVar4 != (Message_private *)0x0) {
    if (pMVar4->Message != (hrgls_Message)0x0) {
      hrgls_MessageDestroy(pMVar4->Message);
      pMVar4 = this->m_private;
    }
    operator_delete(pMVar4);
  }
  pMVar2 = (Message_private *)operator_new(0x10);
  pMVar2->Message = (hrgls_Message)0x0;
  *(undefined8 *)&pMVar2->status = 0;
  this->m_private = pMVar2;
  pMVar4 = copy->m_private;
  phVar3 = (hrgls_Message)0x0;
  if (pMVar4 != (Message_private *)0x0) {
    phVar3 = pMVar4->Message;
    hVar1 = 0;
    if (phVar3 == (hrgls_Message)0x0) {
      hVar1 = 0x3ee;
    }
    pMVar4->status = hVar1;
  }
  hVar1 = hrgls_MessageCopy(pMVar2,phVar3);
  this->m_private->status = hVar1;
  return this;
}

Assistant:

Message &Message::operator = (const Message &copy)
  {
    if (m_private) {
      if (m_private->Message) {
        hrgls_MessageDestroy(m_private->Message);
      }
      delete m_private;
    }
    m_private = new Message_private();
    m_private->status = hrgls_MessageCopy(&m_private->Message, copy.RawMessage());
    return *this;
  }